

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::M68k::Primitive::
     rotate<(InstructionSet::M68k::Operation)90,unsigned_short,CPU::MC68000::ProcessorBase>
               (uint32_t source,unsigned_short *destination,Status *status,
               ProcessorBase *flow_controller)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  
  flow_controller->dynamic_instruction_length_ = (source & 0x3f) + 1;
  if ((source & 0x3f) == 0) {
    uVar3 = 0;
  }
  else {
    if ((source & 0xf) != 0) {
      bVar2 = (byte)source & 0xf;
      *destination = *destination >> bVar2 | *destination << 0x10 - bVar2;
    }
    uVar3 = *destination & 0x8000;
  }
  status->carry_flag = (ulong)uVar3;
  uVar1 = *destination;
  status->zero_result = (ulong)uVar1;
  status->negative_flag = (ulong)(uVar1 & 0x8000);
  status->overflow_flag = 0;
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}